

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O2

void __thiscall
chrono::ChContactContainerSMC::ReportAllContacts
          (ChContactContainerSMC *this,
          shared_ptr<chrono::ChContactContainer::ReportContactCallback> *callback)

{
  _ReportAllContacts<chrono::ChContactSMC<chrono::ChContactable_1vars<3>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_3_3,
             (callback->
             super___shared_ptr<chrono::ChContactContainer::ReportContactCallback,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContacts<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_6_3,
             (callback->
             super___shared_ptr<chrono::ChContactContainer::ReportContactCallback,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContacts<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_6_6,
             (callback->
             super___shared_ptr<chrono::ChContactContainer::ReportContactCallback,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContacts<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_333_3,
             (callback->
             super___shared_ptr<chrono::ChContactContainer::ReportContactCallback,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContacts<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_333_6,
             (callback->
             super___shared_ptr<chrono::ChContactContainer::ReportContactCallback,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContacts<chrono::ChContactSMC<chrono::ChContactable_3vars<3,3,3>,chrono::ChContactable_3vars<3,3,3>>>
            (&this->contactlist_333_333,
             (callback->
             super___shared_ptr<chrono::ChContactContainer::ReportContactCallback,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContacts<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<3>>>
            (&this->contactlist_666_3,
             (callback->
             super___shared_ptr<chrono::ChContactContainer::ReportContactCallback,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContacts<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_1vars<6>>>
            (&this->contactlist_666_6,
             (callback->
             super___shared_ptr<chrono::ChContactContainer::ReportContactCallback,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContacts<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<3,3,3>>>
            (&this->contactlist_666_333,
             (callback->
             super___shared_ptr<chrono::ChContactContainer::ReportContactCallback,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  _ReportAllContacts<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<6,6,6>>>
            (&this->contactlist_666_666,
             (callback->
             super___shared_ptr<chrono::ChContactContainer::ReportContactCallback,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr);
  return;
}

Assistant:

void ChContactContainerSMC::ReportAllContacts(std::shared_ptr<ReportContactCallback> callback) {
    _ReportAllContacts(contactlist_3_3, callback.get());
    _ReportAllContacts(contactlist_6_3, callback.get());
    _ReportAllContacts(contactlist_6_6, callback.get());
    _ReportAllContacts(contactlist_333_3, callback.get());
    _ReportAllContacts(contactlist_333_6, callback.get());
    _ReportAllContacts(contactlist_333_333, callback.get());
    _ReportAllContacts(contactlist_666_3, callback.get());
    _ReportAllContacts(contactlist_666_6, callback.get());
    _ReportAllContacts(contactlist_666_333, callback.get());
    _ReportAllContacts(contactlist_666_666, callback.get());
    //***TODO*** rolling cont.
}